

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O2

int uv_cpu_info(uv_cpu_info_t **cpu_infos,int *count)

{
  int iVar1;
  ulong uVar2;
  uv_cpu_info_t *cpu_infos_00;
  FILE *pFVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  long lVar7;
  int *piVar8;
  uint uVar9;
  uv_cpu_info_t *puVar10;
  ulong __nmemb;
  int count_00;
  ulong uVar11;
  ulong uVar12;
  uint local_484;
  ulong local_480;
  unsigned_long user;
  int *local_470;
  uv_cpu_info_t **local_468;
  unsigned_long irq;
  unsigned_long idle;
  unsigned_long sys;
  unsigned_long nice;
  unsigned_long dummy;
  char buf [1024];
  
  *cpu_infos = (uv_cpu_info_t *)0x0;
  *count = 0;
  uVar2 = sysconf(0x54);
  if ((int)uVar2 == 0) {
    __assert_fail("numcpus != 0","src/unix/linux-core.c",0x1d4,
                  "int uv_cpu_info(uv_cpu_info_t **, int *)");
  }
  if ((int)uVar2 == -1) {
    __assert_fail("numcpus != (unsigned int) -1","src/unix/linux-core.c",0x1d3,
                  "int uv_cpu_info(uv_cpu_info_t **, int *)");
  }
  __nmemb = uVar2 & 0xffffffff;
  cpu_infos_00 = (uv_cpu_info_t *)calloc(__nmemb,0x38);
  if (cpu_infos_00 == (uv_cpu_info_t *)0x0) {
    iVar1 = -0xc;
  }
  else {
    pFVar3 = fopen("/proc/cpuinfo","r");
    local_480 = uVar2;
    local_470 = count;
    local_468 = cpu_infos;
    if (pFVar3 == (FILE *)0x0) {
      piVar8 = __errno_location();
      if (*piVar8 == 0) {
LAB_001130ba:
        lVar7 = sysconf(2);
        if (lVar7 == 0) {
          __assert_fail("clock_ticks != 0","src/unix/linux-core.c",0x26a,
                        "int read_times(unsigned int, uv_cpu_info_t *)");
        }
        if (lVar7 == -1) {
          __assert_fail("clock_ticks != (unsigned long) -1","src/unix/linux-core.c",0x269,
                        "int read_times(unsigned int, uv_cpu_info_t *)");
        }
        pFVar3 = fopen("/proc/stat","r");
        if (pFVar3 == (FILE *)0x0) {
          piVar8 = __errno_location();
          iVar1 = -*piVar8;
        }
        else {
          pcVar4 = fgets(buf,0x400,pFVar3);
          if (pcVar4 == (char *)0x0) {
LAB_00113349:
            abort();
          }
          uVar2 = 0;
          while (((pcVar4 = fgets(buf,0x400,pFVar3), pcVar4 != (char *)0x0 && (uVar2 < __nmemb)) &&
                 (iVar1 = bcmp(buf,"cpu",3), iVar1 == 0))) {
            uVar11 = 4;
            uVar12 = uVar2;
            do {
              uVar9 = (uint)uVar12;
              uVar12 = (uVar12 & 0xffffffff) / 10;
              uVar11 = (ulong)((int)uVar11 + 1);
            } while (9 < uVar9);
            local_484 = (uint)uVar12;
            iVar1 = __isoc99_sscanf(buf,"cpu%u ",&local_484);
            if ((iVar1 != 1) || (uVar2 != local_484)) {
              __assert_fail("sscanf(buf, \"cpu%u \", &n) == 1 && n == num","src/unix/linux-core.c",
                            0x280,"int read_times(unsigned int, uv_cpu_info_t *)");
            }
            iVar1 = __isoc99_sscanf(buf + uVar11,"%lu %lu %lu %lu %lu %lu",&user,&nice,&sys,&idle,
                                    &dummy,&irq);
            if (iVar1 != 6) goto LAB_00113349;
            cpu_infos_00[uVar2].cpu_times.user = user * lVar7;
            cpu_infos_00[uVar2].cpu_times.nice = nice * lVar7;
            cpu_infos_00[uVar2].cpu_times.sys = sys * lVar7;
            cpu_infos_00[uVar2].cpu_times.idle = idle * lVar7;
            cpu_infos_00[uVar2].cpu_times.irq = irq * lVar7;
            uVar2 = uVar2 + 1;
          }
          fclose(pFVar3);
          iVar1 = 0;
          uVar2 = local_480;
        }
      }
      else {
        iVar1 = -*piVar8;
      }
      count_00 = (int)uVar2;
      if (iVar1 == 0) {
        if (cpu_infos_00->speed == 0) {
          piVar8 = &cpu_infos_00->speed;
          for (uVar2 = 0; __nmemb != uVar2; uVar2 = uVar2 + 1) {
            iVar1 = 0;
            snprintf(buf,0x400,"/sys/devices/system/cpu/cpu%u/cpufreq/scaling_cur_freq",
                     uVar2 & 0xffffffff);
            pFVar3 = fopen(buf,"r");
            if (pFVar3 != (FILE *)0x0) {
              iVar1 = __isoc99_fscanf(pFVar3,"%lu",&user);
              if (iVar1 != 1) {
                user = 0;
              }
              fclose(pFVar3);
              iVar1 = (int)(user / 1000);
            }
            *piVar8 = iVar1;
            piVar8 = piVar8 + 0xe;
          }
        }
        *local_468 = cpu_infos_00;
        *local_470 = (int)local_480;
        return 0;
      }
    }
    else {
      uVar2 = 0;
      puVar10 = cpu_infos_00;
      uVar12 = 0;
      while( true ) {
        uVar2 = uVar2 & 0xffffffff;
        while( true ) {
          pcVar4 = fgets(buf,0x400,pFVar3);
          if (pcVar4 == (char *)0x0) {
            fclose(pFVar3);
            if (uVar12 == 0) {
              pcVar4 = "unknown";
            }
            else {
              pcVar4 = cpu_infos_00[(int)uVar12 - 1].model;
            }
            uVar11 = uVar12 & 0xffffffff;
            if ((uVar12 & 0xffffffff) <= __nmemb) {
              uVar11 = __nmemb;
            }
            goto LAB_00113087;
          }
          if ((uVar12 < __nmemb) && (iVar1 = bcmp(buf,"model name\t: ",0xd), iVar1 == 0)) break;
          if ((uVar2 < __nmemb) && (iVar1 = bcmp(buf,read_models_speed_marker,0xb), iVar1 == 0)) {
            iVar1 = atoi(buf + 0xb);
            cpu_infos_00[uVar2].speed = iVar1;
            uVar2 = uVar2 + 1;
          }
        }
        sVar5 = strlen(buf + 0xd);
        pcVar4 = strndup(buf + 0xd,sVar5 - 1);
        if (pcVar4 == (char *)0x0) break;
        cpu_infos_00[uVar12].model = pcVar4;
        puVar10 = puVar10 + 1;
        uVar12 = uVar12 + 1;
      }
      fclose(pFVar3);
LAB_00113320:
      iVar1 = -0xc;
      count_00 = (int)local_480;
    }
    uv_free_cpu_info(cpu_infos_00,count_00);
  }
  return iVar1;
LAB_00113087:
  uVar2 = local_480;
  if (uVar12 == uVar11) goto LAB_001130ba;
  sVar5 = strlen(pcVar4);
  pcVar6 = strndup(pcVar4,sVar5);
  if (pcVar6 == (char *)0x0) goto LAB_00113320;
  puVar10->model = pcVar6;
  puVar10 = puVar10 + 1;
  uVar11 = uVar11 - 1;
  goto LAB_00113087;
}

Assistant:

int uv_cpu_info(uv_cpu_info_t** cpu_infos, int* count) {
  unsigned int numcpus;
  uv_cpu_info_t* ci;
  int err;

  *cpu_infos = NULL;
  *count = 0;

  numcpus = sysconf(_SC_NPROCESSORS_ONLN);
  assert(numcpus != (unsigned int) -1);
  assert(numcpus != 0);

  ci = calloc(numcpus, sizeof(*ci));
  if (ci == NULL)
    return -ENOMEM;

  err = read_models(numcpus, ci);
  if (err == 0)
    err = read_times(numcpus, ci);

  if (err) {
    uv_free_cpu_info(ci, numcpus);
    return err;
  }

  /* read_models() on x86 also reads the CPU speed from /proc/cpuinfo.
   * We don't check for errors here. Worst case, the field is left zero.
   */
  if (ci[0].speed == 0)
    read_speeds(numcpus, ci);

  *cpu_infos = ci;
  *count = numcpus;

  return 0;
}